

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_0::LegalizeJSInterface::run::Fixer::create(Fixer *this)

{
  Fixer *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::(anonymous_namespace)::LegalizeJSInterface::run(wasm::Module*)::Fixer,std::unordered_map<wasm::Name,wasm::Function*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Function*>>>&>
            ((unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
              *)&stack0xffffffffffffffe0);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::LegalizeJSInterface::run(wasm::Module*)::Fixer,std::default_delete<wasm::(anonymous_namespace)::LegalizeJSInterface::run(wasm::Module*)::Fixer>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<Fixer,_std::default_delete<Fixer>_> *)&stack0xffffffffffffffe0);
  std::unique_ptr<Fixer,_std::default_delete<Fixer>_>::~unique_ptr
            ((unique_ptr<Fixer,_std::default_delete<Fixer>_> *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
          return std::make_unique<Fixer>(illegalImportsToLegal);
        }